

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region,_toml::detail::none_t> * __thiscall
toml::detail::
sequence<toml::detail::character<(char)97>,toml::detail::character<(char)108>,toml::detail::character<(char)115>,toml::detail::character<(char)101>>
::invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,
          sequence<toml::detail::character<(char)97>,toml::detail::character<(char)108>,toml::detail::character<(char)115>,toml::detail::character<(char)101>>
          *this,location *loc,region *reg,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first)

{
  bool bVar1;
  value_type *other;
  location local_e0;
  undefined4 local_98;
  failure_type local_81;
  region *local_80;
  undefined1 local_78 [8];
  result<toml::detail::region,_toml::detail::none_t> rslt;
  region *reg_local;
  location *loc_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first_local;
  
  rslt.field_1.succ.value.last_._M_current = (const_iterator)loc;
  character<'a'>::invoke
            ((result<toml::detail::region,_toml::detail::none_t> *)local_78,(location *)this);
  bVar1 = result<toml::detail::region,_toml::detail::none_t>::is_err
                    ((result<toml::detail::region,_toml::detail::none_t> *)local_78);
  if (bVar1) {
    local_80 = reg;
    location::reset((location *)this,(const_iterator)reg);
    none();
    result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_81);
  }
  else {
    other = result<toml::detail::region,_toml::detail::none_t>::unwrap
                      ((result<toml::detail::region,_toml::detail::none_t> *)local_78);
    region::operator+=((region *)loc,other);
    region::region((region *)&local_e0,(region *)loc);
    sequence<toml::detail::character<(char)108>,toml::detail::character<(char)115>,toml::detail::character<(char)101>>
    ::invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (__return_storage_ptr__,
               (sequence<toml::detail::character<(char)108>,toml::detail::character<(char)115>,toml::detail::character<(char)101>>
                *)this,&local_e0,reg,first);
    region::~region((region *)&local_e0);
  }
  local_98 = 1;
  result<toml::detail::region,_toml::detail::none_t>::~result
            ((result<toml::detail::region,_toml::detail::none_t> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc, region reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return sequence<Tail...>::invoke(loc, std::move(reg), first);
    }